

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExtGNU_StatementExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  int iVar3;
  SyntaxToken *pSVar4;
  ostream *poVar5;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  IndexType IVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StatementSyntax *local_68;
  StatementSyntax *statement;
  ExtGNU_EnclosedCompoundStatementExpressionSyntax *gnuExpr;
  allocator<char> local_41;
  string local_40;
  ExpressionSyntax **local_20;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  local_20 = expr;
  expr_local = (ExpressionSyntax **)this;
  pSVar4 = peek(this,1);
  SVar2 = SyntaxToken::kind(pSVar4);
  if (SVar2 == OpenParenToken) {
    pSVar4 = peek(this,2);
    SVar2 = SyntaxToken::kind(pSVar4);
    if (SVar2 == OpenBraceToken) {
      this_00 = SyntaxTree::parseOptions(this->tree_);
      this_01 = ParseOptions::languageExtensions(this_00);
      bVar1 = LanguageExtensions::isEnabled_extGNU_StatementExpressions(this_01);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"GNU statement expressions",&local_41);
        DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
      }
      statement = (StatementSyntax *)
                  makeNode<psy::C::ExtGNU_EnclosedCompoundStatementExpressionSyntax>(this);
      *local_20 = (ExpressionSyntax *)statement;
      IVar6 = consume(this);
      *(IndexType *)&statement[1].super_SyntaxNode.kind_ = IVar6;
      local_68 = (StatementSyntax *)0x0;
      parseCompoundStatement_AtFirst(this,&local_68,None);
      iVar3 = (*(local_68->super_SyntaxNode).super_Managed._vptr_Managed[0xa8])();
      if (CONCAT44(extraout_var,iVar3) != 0) {
        iVar3 = (*(local_68->super_SyntaxNode).super_Managed._vptr_Managed[0xa8])();
        statement[2].super_SyntaxNode.super_Managed._vptr_Managed =
             (_func_int **)CONCAT44(extraout_var_00,iVar3);
      }
      bVar1 = matchOrSkipTo(this,CloseParenToken,(IndexType *)&statement[2].super_SyntaxNode.tree_);
      return bVar1;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xe7);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,"assert failure: `(\' then `{\'");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool Parser::parseExtGNU_StatementExpression_AtFirst(ExpressionSyntax *&expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenParenToken
                        && peek(2).kind() == SyntaxKind::OpenBraceToken,
                  return false,
                  "assert failure: `(' then `{'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_StatementExpressions())
        diagReporter_.ExpectedFeature("GNU statement expressions");

    auto gnuExpr = makeNode<ExtGNU_EnclosedCompoundStatementExpressionSyntax>();
    expr = gnuExpr;
    gnuExpr->openParenTkIdx_ = consume();

    StatementSyntax* statement = nullptr;
    parseCompoundStatement_AtFirst(statement, StatementContext::None);
    if (statement->asCompoundStatement())
        gnuExpr->stmt_ = statement->asCompoundStatement();
    return matchOrSkipTo(SyntaxKind::CloseParenToken, &gnuExpr->closeParenTkIdx_);
}